

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O2

Ivy_Obj_t * Ivy_Multi_rec(Ivy_Man_t *p,Ivy_Obj_t **ppObjs,int nObjs,Ivy_Type_t Type)

{
  int nObjs_00;
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t *p1;
  
  if (nObjs == 1) {
    return *ppObjs;
  }
  nObjs_00 = nObjs / 2;
  pIVar1 = Ivy_Multi_rec(p,ppObjs,nObjs_00,Type);
  p1 = Ivy_Multi_rec(p,ppObjs + nObjs_00,nObjs - nObjs_00,Type);
  pIVar1 = Ivy_Oper(p,pIVar1,p1,Type);
  return pIVar1;
}

Assistant:

Ivy_Obj_t * Ivy_Multi_rec( Ivy_Man_t * p, Ivy_Obj_t ** ppObjs, int nObjs, Ivy_Type_t Type )
{
    Ivy_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Ivy_Multi_rec( p, ppObjs,           nObjs/2,         Type );
    pObj2 = Ivy_Multi_rec( p, ppObjs + nObjs/2, nObjs - nObjs/2, Type );
    return Ivy_Oper( p, pObj1, pObj2, Type );
}